

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::BeginEnumNames(GoGenerator *this,EnumDef *enum_def,string *code_ptr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((string *)code_ptr);
  GetEnumTypeName_abi_cxx11_(&local_40,this,enum_def);
  std::operator+(&local_80," = map[",&local_40);
  std::operator+(&local_60,&local_80,"]string{\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void BeginEnumNames(const EnumDef &enum_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "var EnumNames";
    code += enum_def.name;
    code += " = map[" + GetEnumTypeName(enum_def) + "]string{\n";
  }